

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

pair<double,_unsigned_long> units::getPrefixMultiplierWord(string *unit)

{
  char *__s1;
  int iVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  tuple<const_char_*,_double,_int> *ptVar4;
  __tuple_element_t<0UL,_tuple<const_char_*,_double,_int>_> *ppcVar5;
  char *__s2;
  __tuple_element_t<2UL,_tuple<const_char_*,_double,_int>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<const_char_*,_double,_int>_> *__x;
  tuple<const_char_*,_double,_int> *res;
  int local_3c;
  double local_38 [2];
  char *local_28;
  tuple<const_char_*,_double,_int> *local_20;
  pair<double,_unsigned_long> local_10;
  
  pvVar2 = std::array<std::tuple<const_char_*,_double,_int>,_36UL>::begin
                     ((array<std::tuple<const_char_*,_double,_int>,_36UL> *)0x78ae35);
  pvVar3 = std::array<std::tuple<const_char_*,_double,_int>,_36UL>::end
                     ((array<std::tuple<const_char_*,_double,_int>,_36UL> *)0x78ae46);
  local_28 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x78ae55);
  ptVar4 = std::
           lower_bound<std::tuple<char_const*,double,int>const*,char_const*,units::getPrefixMultiplierWord(std::__cxx11::string_const&)::__0>
                     (pvVar2,pvVar3,&local_28);
  local_20 = ptVar4;
  pvVar2 = std::array<std::tuple<const_char_*,_double,_int>,_36UL>::end
                     ((array<std::tuple<const_char_*,_double,_int>,_36UL> *)0x78ae89);
  if (ptVar4 != pvVar2) {
    ppcVar5 = std::get<0ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x78aea0);
    __s1 = *ppcVar5;
    __s2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x78aeb2);
    p_Var6 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x78aec1);
    iVar1 = strncmp(__s1,__s2,(long)*p_Var6);
    if (iVar1 == 0) {
      __x = std::get<1ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x78aee2);
      p_Var6 = std::get<2ul,char_const*,double,int>((tuple<const_char_*,_double,_int> *)0x78aef1);
      std::pair<double,_unsigned_long>::pair<const_int_&,_true>(&local_10,__x,p_Var6);
      return local_10;
    }
  }
  local_38[0] = 0.0;
  local_3c = 0;
  std::pair<double,_unsigned_long>::pair<double,_int,_true>(&local_10,local_38,&local_3c);
  return local_10;
}

Assistant:

static std::pair<double, size_t>
    getPrefixMultiplierWord(const std::string& unit)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto res = std::lower_bound(
        prefixWords.begin(),
        prefixWords.end(),
        unit.c_str(),
        [](const utup& prefix, const char* val) {
            return (strncmp(std::get<0>(prefix), val, std::get<2>(prefix)) < 0);
        });
    if (res != prefixWords.end()) {
        if (strncmp(std::get<0>(*res), unit.c_str(), std::get<2>(*res)) == 0) {
            return {std::get<1>(*res), std::get<2>(*res)};
        }
    }
    return {0.0, 0};
}